

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O3

int xmlPatternGrow(xmlPatternPtr comp)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  xmlStepOpPtr pxVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = comp->maxStep;
  if ((int)uVar1 < 1) {
    uVar6 = 10;
  }
  else {
    if (999999999 < uVar1) {
      return -1;
    }
    uVar5 = uVar1 + 1 >> 1;
    uVar2 = uVar5 + uVar1;
    if (1000000000 - uVar5 < uVar1) {
      uVar2 = 1000000000;
    }
    uVar6 = (ulong)uVar2;
  }
  pxVar4 = (xmlStepOpPtr)(*xmlRealloc)(comp->steps,uVar6 * 0x18);
  if (pxVar4 == (xmlStepOpPtr)0x0) {
    iVar3 = -1;
  }
  else {
    comp->steps = pxVar4;
    comp->maxStep = (int)uVar6;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
xmlPatternGrow(xmlPatternPtr comp) {
    xmlStepOpPtr temp;
    int newSize;

    newSize = xmlGrowCapacity(comp->maxStep, sizeof(temp[0]),
                              10, XML_MAX_ITEMS);
    if (newSize < 0)
        return(-1);
    temp = xmlRealloc(comp->steps, newSize * sizeof(temp[0]));
    if (temp == NULL)
        return(-1);
    comp->steps = temp;
    comp->maxStep = newSize;

    return(0);
}